

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O2

string * sciplot::gnuplot::cleanpath(string *__return_storage_ptr__,string *path)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  string invalidchars;
  allocator<char> local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,":*?!\"<>|",&local_31);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  _Var1._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
  _Var1 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<sciplot::gnuplot::cleanpath(std::__cxx11::string)::_lambda(char)_1_>>
                    (_Var1,_Var1._M_current + __return_storage_ptr__->_M_string_length,
                     (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_HorstBaerbel[P]approx_sciplot_sciplot_Utils_hpp:323:63)>
                      )local_30);
  std::__cxx11::string::erase
            (__return_storage_ptr__,_Var1._M_current,
             (__return_storage_ptr__->_M_dataplus)._M_p + __return_storage_ptr__->_M_string_length);
  std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

inline auto cleanpath(std::string path) -> std::string
{
    const std::string invalidchars = ":*?!\"<>|";
    std::string result = path;
    result.erase(std::remove_if(result.begin(), result.end(), [&invalidchars](char c) { return (std::find(invalidchars.cbegin(), invalidchars.cend(), c) != invalidchars.cend()); }), result.end());
    return result;
}